

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Table>::RefPtr
          (RefPtr<wabt::interp::Table> *this,Store *store,Ref ref)

{
  long lVar1;
  long lVar2;
  size_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  Module *pMVar6;
  bool bVar7;
  Index IVar8;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar9;
  Frame *pFVar10;
  Frame *pFVar11;
  Ref ref_00;
  Ref ref_01;
  Store *this_00;
  Store *this_01;
  Ref RVar12;
  Ref RVar13;
  size_t *psVar14;
  Ref RStack_70;
  Store *pSStack_68;
  undefined8 *puStack_60;
  undefined8 uStack_58;
  Ref RStack_48;
  Store *pSStack_40;
  RefPtr<wabt::interp::Table> *pRStack_38;
  size_t sStack_30;
  Ref local_20;
  
  sStack_30 = 0x1900ed;
  bVar7 = Store::Is<wabt::interp::Table>(store,ref);
  if (bVar7) {
    sStack_30 = 0x190102;
    local_20.index = ref.index;
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar8;
    sStack_30 = 0x190112;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (Table *)(puVar9->_M_t).
                          super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                          .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  sStack_30 = 0x190131;
  this_00 = store;
  RVar12.index = ref.index;
  interp::RefPtr();
  uStack_58 = 0x19014f;
  pSStack_40 = store;
  pRStack_38 = this;
  sStack_30 = ref.index;
  bVar7 = Store::Is<wabt::interp::Memory>(this_00,ref_00);
  if (bVar7) {
    uStack_58 = 0x190164;
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this_00->roots_,&RStack_48);
    *(Index *)(RVar12.index + 0x10) = IVar8;
    uStack_58 = 0x190174;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&this_00->objects_,ref_00.index);
    *(Object **)RVar12.index =
         (puVar9->_M_t).
         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>.
         _M_t.
         super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
         super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    *(Store **)(RVar12.index + 8) = this_00;
    return;
  }
  uStack_58 = 0x190193;
  this_01 = this_00;
  RVar13.index = ref_00.index;
  interp::RefPtr();
  pSStack_68 = this_00;
  puStack_60 = (undefined8 *)RVar12.index;
  bVar7 = Store::Is<wabt::interp::Func>(this_01,ref_01);
  if (bVar7) {
    IVar8 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this_01->roots_,&RStack_70);
    *(Index *)(RVar13.index + 0x10) = IVar8;
    puVar9 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&this_01->objects_,ref_01.index);
    *(Object **)RVar13.index =
         (puVar9->_M_t).
         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>.
         _M_t.
         super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
         super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    *(Store **)(RVar13.index + 8) = this_01;
    return;
  }
  RVar12.index = ref_01.index;
  interp::RefPtr();
  if ((ulong)this_01 >> 0x3a != 0) {
    std::__throw_length_error("vector::reserve");
  }
  lVar1 = *(long *)RVar12.index;
  if ((Store *)(*(long *)(RVar12.index + 0x10) - lVar1 >> 5) < this_01) {
    lVar2 = *(long *)(RVar12.index + 8);
    pFVar10 = __gnu_cxx::new_allocator<wabt::interp::Frame>::allocate
                        ((new_allocator<wabt::interp::Frame> *)RVar12.index,(size_type)this_01,
                         (void *)0x0);
    psVar14 = *(size_t **)RVar12.index;
    psVar3 = *(size_t **)(RVar12.index + 8);
    pFVar11 = pFVar10;
    if (psVar14 != psVar3) {
      do {
        sVar4 = *psVar14;
        sVar5 = psVar14[1];
        pMVar6 = (Module *)psVar14[3];
        pFVar11->inst = (Instance *)psVar14[2];
        pFVar11->mod = pMVar6;
        (pFVar11->func).index = sVar4;
        pFVar11->values = (int)sVar5;
        pFVar11->offset = (int)(sVar5 >> 0x20);
        psVar14 = psVar14 + 4;
        pFVar11 = pFVar11 + 1;
      } while (psVar14 != psVar3);
      psVar14 = *(size_t **)RVar12.index;
    }
    if (psVar14 != (size_t *)0x0) {
      operator_delete(psVar14);
    }
    *(Frame **)RVar12.index = pFVar10;
    *(long *)(RVar12.index + 8) = (lVar2 - lVar1) + (long)pFVar10;
    *(Frame **)(RVar12.index + 0x10) = pFVar10 + (long)this_01;
  }
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}